

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

ll_elem * pred(ll_head *q_head,ll_elem *n)

{
  ulong *puVar1;
  atomic_size_t *paVar2;
  long *plVar3;
  ulong *puVar4;
  long lVar5;
  atomic_size_t aVar6;
  ulong uVar7;
  ulong uVar8;
  ll_elem *plVar9;
  ll_elem *n_00;
  ll_elem *plVar10;
  ulong uVar11;
  ulong uVar12;
  ll_elem *old;
  bool bVar13;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x147,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  uVar11 = (ulong)n & 0xfffffffffffffffc;
  if (uVar11 == 0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x149,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  puVar1 = (ulong *)(uVar11 + 8);
  plVar9 = *(ll_elem **)(uVar11 + 8);
  do {
    LOCK();
    n_00 = (ll_elem *)*puVar1;
    bVar13 = plVar9 == n_00;
    if (bVar13) {
      *puVar1 = (ulong)plVar9 | 1;
      n_00 = plVar9;
    }
    UNLOCK();
    plVar9 = n_00;
  } while (!bVar13);
  while (((ulong)n_00 & 1) != 0) {
    plVar9 = (ll_elem *)*puVar1;
    do {
      LOCK();
      n_00 = (ll_elem *)*puVar1;
      bVar13 = plVar9 == n_00;
      if (bVar13) {
        *puVar1 = (ulong)plVar9 | 1;
        n_00 = plVar9;
      }
      UNLOCK();
      plVar9 = n_00;
    } while (!bVar13);
  }
  uVar8 = (ulong)n_00 & 0xfffffffffffffffc;
  if (uVar8 != 0) {
    LOCK();
    *(long *)(uVar8 + 0x10) = *(long *)(uVar8 + 0x10) + 1;
    UNLOCK();
  }
  LOCK();
  uVar12 = *puVar1;
  *puVar1 = *puVar1 & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar12 & 1) == 0) {
LAB_00102085:
    __assert_fail("old & DEREF",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0,
                  "struct ll_elem *deref(elem_ptr_t *)");
  }
  if (uVar8 == 0) {
    return n_00;
  }
joined_r0x00101d72:
  do {
    if (n_00 < (ll_elem *)0x4) {
      __assert_fail("ptr_clear(p) != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x155,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
    }
    if (((ulong)n_00 & 2) == 0) {
      plVar9 = succ(q_head,n_00);
      if (plVar9 < (ll_elem *)0x4) {
        __assert_fail("ptr_clear(ps) != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x15f,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
      }
      while ((uVar8 = (ulong)plVar9 & 0xfffffffffffffffc, uVar8 != uVar11 &&
             (((ulong)n_00 & 2) == 0))) {
        if (((ulong)n_00 & 1) != 0) goto LAB_00102066;
        do {
          LOCK();
          plVar9 = (ll_elem *)*puVar1;
          bVar13 = n_00 == plVar9;
          if (bVar13) {
            *puVar1 = uVar8 | 1;
            plVar9 = n_00;
          }
          UNLOCK();
          plVar10 = n_00;
        } while ((!bVar13) &&
                (plVar10 = plVar9, (ll_elem *)((ulong)plVar9 & 0xfffffffffffffffe) == n_00));
        if (bVar13) {
          LOCK();
          *(long *)(uVar8 + 0x10) = *(long *)(uVar8 + 0x10) + 1;
          UNLOCK();
          LOCK();
          uVar12 = *puVar1;
          *puVar1 = *puVar1 & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar12 & 1) == 0) goto LAB_001020a4;
          LOCK();
          paVar2 = &n_00->refcnt;
          uVar12 = *paVar2;
          *paVar2 = *paVar2 - 2;
          UNLOCK();
          if (uVar12 < 2) goto LAB_00102047;
          n_00 = (ll_elem *)((uint)plVar10 & 2 | uVar8);
        }
        else {
          LOCK();
          plVar3 = (long *)(uVar8 + 0x10);
          lVar5 = *plVar3;
          *plVar3 = *plVar3 + -1;
          UNLOCK();
          if (lVar5 == 0) goto LAB_00102047;
          LOCK();
          paVar2 = &n_00->refcnt;
          aVar6 = *paVar2;
          *paVar2 = *paVar2 - 1;
          UNLOCK();
          if (aVar6 == 0) goto LAB_00102047;
          plVar9 = (ll_elem *)*puVar1;
          do {
            LOCK();
            n_00 = (ll_elem *)*puVar1;
            bVar13 = plVar9 == n_00;
            if (bVar13) {
              *puVar1 = (ulong)plVar9 | 1;
              n_00 = plVar9;
            }
            UNLOCK();
            plVar9 = n_00;
          } while (!bVar13);
          while (((ulong)n_00 & 1) != 0) {
            plVar9 = (ll_elem *)*puVar1;
            do {
              LOCK();
              n_00 = (ll_elem *)*puVar1;
              bVar13 = plVar9 == n_00;
              if (bVar13) {
                *puVar1 = (ulong)plVar9 | 1;
                n_00 = plVar9;
              }
              UNLOCK();
              plVar9 = n_00;
            } while (!bVar13);
          }
          if (((ulong)n_00 & 0xfffffffffffffffc) != 0) {
            LOCK();
            plVar3 = (long *)(((ulong)n_00 & 0xfffffffffffffffc) + 0x10);
            *plVar3 = *plVar3 + 1;
            UNLOCK();
          }
          LOCK();
          uVar8 = *puVar1;
          *puVar1 = *puVar1 & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar8 & 1) == 0) goto LAB_00102085;
        }
        plVar9 = succ(q_head,n_00);
      }
      LOCK();
      plVar3 = (long *)(uVar8 + 0x10);
      lVar5 = *plVar3;
      *plVar3 = *plVar3 + -1;
      UNLOCK();
      if (lVar5 == 0) goto LAB_00102047;
    }
    uVar8 = (ulong)n_00 & 0xfffffffffffffffc;
    if ((*(ulong *)(uVar8 + 8) & 2) == 0) {
      return (ll_elem *)((uint)*puVar1 & 2 | uVar8);
    }
    puVar4 = (ulong *)(uVar8 + 8);
    plVar9 = (ll_elem *)*puVar4;
    do {
      LOCK();
      plVar10 = (ll_elem *)*puVar4;
      bVar13 = plVar9 == plVar10;
      if (bVar13) {
        *puVar4 = (ulong)plVar9 | 1;
        plVar10 = plVar9;
      }
      UNLOCK();
      plVar9 = plVar10;
    } while (!bVar13);
    while (((ulong)plVar10 & 1) != 0) {
      plVar9 = (ll_elem *)*puVar4;
      do {
        LOCK();
        plVar10 = (ll_elem *)*puVar4;
        bVar13 = plVar9 == plVar10;
        if (bVar13) {
          *puVar4 = (ulong)plVar9 | 1;
          plVar10 = plVar9;
        }
        UNLOCK();
        plVar9 = plVar10;
      } while (!bVar13);
    }
    uVar12 = (ulong)plVar10 & 0xfffffffffffffffc;
    if (uVar12 != 0) {
      LOCK();
      *(long *)(uVar12 + 0x10) = *(long *)(uVar12 + 0x10) + 1;
      UNLOCK();
    }
    LOCK();
    uVar7 = *puVar4;
    *puVar4 = *puVar4 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar7 & 1) == 0) goto LAB_00102085;
    if (((ulong)n_00 & 1) != 0) {
LAB_00102066:
      __assert_fail("!((uintptr_t)old & DEREF)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xdb
                    ,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
    }
    do {
      LOCK();
      plVar9 = (ll_elem *)*puVar1;
      bVar13 = n_00 == plVar9;
      if (bVar13) {
        *puVar1 = ((uint)n_00 & 2) + uVar12 + 1;
        plVar9 = n_00;
      }
      UNLOCK();
    } while ((!bVar13) && ((ll_elem *)((ulong)plVar9 & 0xfffffffffffffffe) == n_00));
    if (bVar13) break;
    LOCK();
    plVar3 = (long *)(uVar8 + 0x10);
    lVar5 = *plVar3;
    *plVar3 = *plVar3 + -1;
    UNLOCK();
    if (lVar5 == 0) goto LAB_00102047;
    LOCK();
    plVar3 = (long *)(uVar12 + 0x10);
    lVar5 = *plVar3;
    *plVar3 = *plVar3 + -1;
    UNLOCK();
    if (lVar5 == 0) goto LAB_00102047;
    plVar9 = (ll_elem *)*puVar1;
    do {
      LOCK();
      n_00 = (ll_elem *)*puVar1;
      bVar13 = plVar9 == n_00;
      if (bVar13) {
        *puVar1 = (ulong)plVar9 | 1;
        n_00 = plVar9;
      }
      UNLOCK();
      plVar9 = n_00;
    } while (!bVar13);
    while (((ulong)n_00 & 1) != 0) {
      plVar9 = (ll_elem *)*puVar1;
      do {
        LOCK();
        n_00 = (ll_elem *)*puVar1;
        bVar13 = plVar9 == n_00;
        if (bVar13) {
          *puVar1 = (ulong)plVar9 | 1;
          n_00 = plVar9;
        }
        UNLOCK();
        plVar9 = n_00;
      } while (!bVar13);
    }
    if (((ulong)n_00 & 0xfffffffffffffffc) != 0) {
      LOCK();
      plVar3 = (long *)(((ulong)n_00 & 0xfffffffffffffffc) + 0x10);
      *plVar3 = *plVar3 + 1;
      UNLOCK();
    }
    LOCK();
    uVar8 = *puVar1;
    *puVar1 = *puVar1 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar8 & 1) == 0) goto LAB_00102085;
  } while( true );
  LOCK();
  *(long *)(uVar12 + 0x10) = *(long *)(uVar12 + 0x10) + 1;
  UNLOCK();
  LOCK();
  uVar12 = *puVar1;
  *puVar1 = *puVar1 & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar12 & 1) == 0) {
LAB_001020a4:
    __assert_fail("p & DEREF",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xf5,
                  "void ptr_clear_deref(elem_ptr_t *)");
  }
  LOCK();
  puVar4 = (ulong *)(uVar8 + 0x10);
  uVar8 = *puVar4;
  *puVar4 = *puVar4 - 2;
  UNLOCK();
  n_00 = plVar10;
  if (uVar8 < 2) {
LAB_00102047:
    __assert_fail("old >= count",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                  "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
  }
  goto joined_r0x00101d72;
}

Assistant:

static struct ll_elem*
pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *ps, *pp;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	p = deref(&n->pred);
	if (ptr_clear(p) == NULL)
		return p;

	for (;;) {
		/*
		 * Predecessor cannot be null,
		 * since it is on the queue and we have a reference to n,
		 * preventing it from leaving the queue.
		 */
		assert(ptr_clear(p) != NULL);

		/*
		 * Search forward to reach the direct predecessor of
		 * n between p and n.  Note that we cannot search for
		 * a better predecessor when p holds the deletion mark
		 * for n.
		 */
		if (!deleted_ptr(p)) {
			ps = succ(q_head, p);
			assert(ptr_clear(ps) != NULL);
			while (ptr_clear(ps) != n && !deleted_ptr(p)) {
				p_ = p;
				if (ptr_cas(&n->pred, &p_, ps)) {
					/* cas succeeded */
					deref_acquire(ps, 1);
					ptr_clear_deref(&n->pred);
					deref_release(q_head, p, 2);
					p = flag_combine(ps, p_);
				} else {
					/* cas failed */
					deref_release(q_head, ps, 1);
					deref_release(q_head, p, 1);

					/*
					 * Cannot do p = p_, since we do not
					 * have the lock on n->pred at the
					 * moment and thus cannot acquire the
					 * reference counter on p_.
					 */
					p = deref(&n->pred);
				}

				ps = succ(q_head, p);
			}
			deref_release(q_head, ps, 1);
		}

		/*
		 * p is the best predecessor, provided it is not a deleted value.
		 */
		if (!deleted(p))
			break;		/* GUARD */

		/*
		 * Skip to the predecessor of p, since p is deleted.
		 */
		pp = deref(&ptr_clear(p)->pred);
		p_ = p;
		if (ptr_cas(&n->pred, &p_, pp)) {
			/* cas succeeded */
			deref_acquire(pp, 1);
			ptr_clear_deref(&n->pred);
			deref_release(q_head, p, 2);
			p = pp;
		} else {
			/* cas failed */
			deref_release(q_head, p, 1);
			deref_release(q_head, pp, 1);
			p = deref(&n->pred);
		}
	}

	return flag_combine(p, (struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed));
}